

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
          (TemporaryBuffer *this,uint ch)

{
  uint ch_local;
  TemporaryBuffer *this_local;
  
  return;
}

Assistant:

void AppendCh(uint ch)
        {
            if (performAppend)
            {
                if (m_ichCur >= m_cchMax)
                {
                    Grow();
                }

                Assert(m_ichCur < m_cchMax);
                __analysis_assume(m_ichCur < m_cchMax);

                m_prgch[m_ichCur++] = static_cast<OLECHAR>(ch);
            }
        }